

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::ReadPackedEnumNoInline
               (CodedInputStream *input,_func_bool_int *is_valid,RepeatedField<int> *values)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  int local_34;
  Limit local_30;
  int value;
  Limit limit;
  uint32 length;
  RepeatedField<int> *values_local;
  _func_bool_int *is_valid_local;
  CodedInputStream *input_local;
  
  _limit = values;
  values_local = (RepeatedField<int> *)is_valid;
  is_valid_local = (_func_bool_int *)input;
  bVar1 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&value);
  if (bVar1) {
    local_30 = io::CodedInputStream::PushLimit((CodedInputStream *)is_valid_local,value);
    while (iVar2 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)is_valid_local),
          0 < iVar2) {
      bVar1 = ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                        ((CodedInputStream *)is_valid_local,&local_34);
      if (!bVar1) {
        return false;
      }
      if ((values_local == (RepeatedField<int> *)0x0) ||
         (uVar3 = (*(code *)values_local)(local_34), (uVar3 & 1) != 0)) {
        RepeatedField<int>::Add(_limit,&local_34);
      }
    }
    io::CodedInputStream::PopLimit((CodedInputStream *)is_valid_local,local_30);
    input_local._7_1_ = true;
  }
  else {
    input_local._7_1_ = false;
  }
  return input_local._7_1_;
}

Assistant:

bool WireFormatLite::ReadPackedEnumNoInline(io::CodedInputStream* input,
                                            bool (*is_valid)(int),
                                            RepeatedField<int>* values) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!google::protobuf::internal::WireFormatLite::ReadPrimitive<
        int, WireFormatLite::TYPE_ENUM>(input, &value)) {
      return false;
    }
    if (is_valid == NULL || is_valid(value)) {
      values->Add(value);
    }
  }
  input->PopLimit(limit);
  return true;
}